

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,char delimiter)

{
  char __rhs;
  char *pcVar1;
  pointer pcVar2;
  long lVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  string *this;
  bool bVar5;
  allocator local_f5;
  uint local_f4;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string delims;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ::std::__cxx11::string::string((string *)&delims,"\'\"`",(allocator *)&value);
  trim(str);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f4 = (uint)(byte)delimiter;
  do {
    if (str->_M_string_length == 0) {
      ::std::__cxx11::string::~string((string *)&delims);
      return __return_storage_ptr__;
    }
    lVar3 = ::std::__cxx11::string::find((char)&delims,(ulong)(uint)(int)*(str->_M_dataplus)._M_p);
    pcVar1 = (str->_M_dataplus)._M_p;
    if (lVar3 == -1) {
      _Var4 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>>
                        (pcVar1,pcVar1 + str->_M_string_length,local_f4);
      pcVar2 = (str->_M_dataplus)._M_p;
      if (_Var4._M_current != pcVar2 + str->_M_string_length) {
        value._M_dataplus._M_p = (pointer)&value.field_2;
        ::std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&value,pcVar2,_Var4._M_current);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&value);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&local_d0,_Var4._M_current + 1,
                   (str->_M_dataplus)._M_p + str->_M_string_length);
        ::std::__cxx11::string::operator=((string *)str,(string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        this = &value;
        goto LAB_0013a67d;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,str);
      ::std::__cxx11::string::assign((char *)str);
    }
    else {
      bVar5 = false;
      __rhs = *pcVar1;
      while( true ) {
        lVar3 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)__rhs);
        if (lVar3 == -1) break;
        if ((str->_M_dataplus)._M_p[lVar3 + -1] != '\\') {
          ::std::__cxx11::string::substr((ulong)&value,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&value);
          ::std::__cxx11::string::~string((string *)&value);
          ::std::__cxx11::string::substr((ulong)&value,(ulong)str);
          ::std::__cxx11::string::operator=((string *)str,(string *)&value);
          ::std::__cxx11::string::~string((string *)&value);
          goto LAB_0013a5b6;
        }
        bVar5 = true;
      }
      ::std::__cxx11::string::substr((ulong)&value,(ulong)str);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&value);
      ::std::__cxx11::string::~string((string *)&value);
      ::std::__cxx11::string::assign((char *)str);
LAB_0013a5b6:
      if (bVar5) {
        ::std::__cxx11::string::string
                  ((string *)&local_50,
                   (string *)
                   ((__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1));
        ::std::__cxx11::string::string((string *)&local_d0,"\\",&local_f5);
        ::std::operator+(&local_70,&local_d0,__rhs);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_b0,'\x01');
        find_and_replace(&value,&local_50,&local_70,&local_b0);
        ::std::__cxx11::string::operator=
                  ((string *)
                   ((__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1),(string *)&value);
        ::std::__cxx11::string::~string((string *)&value);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_d0);
        this = &local_50;
LAB_0013a67d:
        ::std::__cxx11::string::~string((string *)this);
      }
    }
    trim(str);
  } while( true );
}

Assistant:

inline std::vector<std::string> split_up(std::string str, char delimiter = '\0') {

    const std::string delims("\'\"`");
    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? (std::isspace<char>(ch, std::locale()) != 0) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    bool embeddedQuote = false;
    char keyChar = ' ';
    while(!str.empty()) {
        if(delims.find_first_of(str[0]) != std::string::npos) {
            keyChar = str[0];
            auto end = str.find_first_of(keyChar, 1);
            while((end != std::string::npos) && (str[end - 1] == '\\')) { // deal with escaped quotes
                end = str.find_first_of(keyChar, end + 1);
                embeddedQuote = true;
            }
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        // transform any embedded quotes into the regular character
        if(embeddedQuote) {
            output.back() = find_and_replace(output.back(), std::string("\\") + keyChar, std::string(1, keyChar));
            embeddedQuote = false;
        }
        trim(str);
    }
    return output;
}